

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O3

int ssl_parse_server_key_exchange(mbedtls_ssl_context *ssl)

{
  mbedtls_key_exchange_type_t mVar1;
  mbedtls_ssl_ciphersuite_t *info;
  mbedtls_x509_crt *pmVar2;
  byte bVar3;
  int iVar4;
  mbedtls_pk_type_t mVar5;
  mbedtls_pk_type_t mVar6;
  ulong uVar7;
  mbedtls_md_info_t *pmVar8;
  int iVar9;
  ushort *puVar10;
  mbedtls_md_type_t md_type;
  char *pcVar11;
  ushort *puVar12;
  size_t sVar13;
  ushort *end;
  uchar *puVar14;
  size_t hash_len;
  mbedtls_md_type_t md_alg;
  uchar hash [64];
  mbedtls_md_context_t ctx;
  mbedtls_md5_context mbedtls_md5;
  ushort *local_148;
  mbedtls_md_type_t local_140;
  mbedtls_pk_type_t local_13c;
  uchar *local_138;
  mbedtls_md_type_t local_12c;
  uchar local_128 [16];
  uchar local_118 [48];
  mbedtls_sha1_context local_e8;
  mbedtls_md5_context local_88;
  
  info = ssl->transform_negotiate->ciphersuite_info;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x7ef,"=> parse server key exchange");
  if (info->key_exchange - MBEDTLS_KEY_EXCHANGE_ECDH_RSA < 2) {
    pmVar2 = ssl->session_negotiate->peer_cert;
    if (pmVar2 == (mbedtls_x509_crt *)0x0) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x7ca,"certificate required");
      iVar4 = -0x7700;
    }
    else {
      iVar4 = mbedtls_pk_can_do(&pmVar2->pk,MBEDTLS_PK_ECKEY);
      if (iVar4 == 0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x7d1,"server key not ECDH capable");
        iVar4 = -0x6d00;
      }
      else {
        iVar4 = mbedtls_ecdh_get_params
                          (&ssl->handshake->ecdh_ctx,
                           (mbedtls_ecp_keypair *)(ssl->session_negotiate->peer_cert->pk).pk_ctx,
                           MBEDTLS_ECDH_THEIRS);
        if (iVar4 == 0) {
          iVar4 = ssl_check_server_ecdh_params(ssl);
          if (iVar4 == 0) {
            iVar4 = 0x807;
            goto LAB_0016609e;
          }
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x7e0,"bad server certificate (ECDH curve)");
          iVar4 = -0x7a00;
        }
        else {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x7da,"mbedtls_ecdh_get_params",iVar4);
        }
      }
    }
    pcVar11 = "ssl_get_ecdh_params_from_cert";
    iVar9 = 0x803;
    goto LAB_00166269;
  }
  if (info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA) {
    iVar4 = 0x7f4;
LAB_0016609e:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,iVar4,"<= skip parse server key exchange");
    ssl->state = ssl->state + 1;
    return 0;
  }
  iVar4 = mbedtls_ssl_read_record(ssl);
  if (iVar4 != 0) {
    pcVar11 = "mbedtls_ssl_read_record";
    iVar9 = 0x812;
    goto LAB_00166269;
  }
  if (ssl->in_msgtype != 0x16) {
    pcVar11 = "bad server key exchange message";
    iVar9 = 1;
    iVar4 = 0x818;
    goto LAB_001662a1;
  }
  puVar14 = ssl->in_msg;
  if (*puVar14 != '\f') {
    if ((info->key_exchange | MBEDTLS_KEY_EXCHANGE_DHE_RSA) != MBEDTLS_KEY_EXCHANGE_RSA_PSK) {
      pcVar11 = "bad server key exchange message";
      iVar9 = 1;
      iVar4 = 0x829;
      goto LAB_001662a1;
    }
    ssl->record_read = 1;
    goto LAB_00166765;
  }
  uVar7 = (ulong)(*(uint *)&ssl->conf->field_0x164 & 2);
  puVar12 = (ushort *)(puVar14 + uVar7 * 4 + 4);
  end = (ushort *)(puVar14 + ssl->in_hslen);
  local_148 = puVar12;
  mbedtls_debug_print_buf
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x82f,"server key exchange",(uchar *)puVar12,ssl->in_hslen - (uVar7 * 4 + 4));
  mVar1 = info->key_exchange;
  puVar10 = local_148;
  if ((mVar1 - MBEDTLS_KEY_EXCHANGE_PSK < 4) &&
     (puVar10 = (ushort *)((long)puVar12 + (ulong)(ushort)(*puVar12 << 8 | *puVar12 >> 8) + 2),
     end < puVar10)) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x72a,"bad server key exchange message (psk_identity_hint length)");
    iVar4 = 0x839;
    goto LAB_00166598;
  }
  local_148 = puVar10;
  if (MBEDTLS_KEY_EXCHANGE_ECDHE_PSK < mVar1) {
LAB_00166330:
    iVar4 = 0x867;
LAB_00166469:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,iVar4,"should never happen");
    return -0x6c00;
  }
  if ((0x118U >> (mVar1 & 0x1f) & 1) == 0) {
    if ((0x44U >> (mVar1 & 0x1f) & 1) == 0) {
      if ((0xa0U >> (mVar1 & 0x1f) & 1) == 0) goto LAB_00166330;
    }
    else {
      iVar4 = ssl_parse_server_dh_params(ssl,(uchar **)&local_148,(uchar *)end);
      if (iVar4 != 0) {
        iVar4 = 0x84e;
        goto LAB_00166598;
      }
    }
  }
  else {
    iVar4 = ssl_parse_server_ecdh_params(ssl,(uchar **)&local_148,(uchar *)end);
    if (iVar4 != 0) {
      iVar4 = 0x85e;
      goto LAB_00166598;
    }
  }
  puVar10 = local_148;
  if (info->key_exchange - MBEDTLS_KEY_EXCHANGE_DHE_RSA < 3) {
    local_140 = MBEDTLS_MD_NONE;
    local_13c = MBEDTLS_PK_NONE;
    puVar14 = ssl->in_msg;
    bVar3 = ssl->conf->field_0x164;
    if (ssl->minor_ver == 3) {
      iVar4 = ssl_parse_signature_algorithm
                        (ssl,(uchar **)&local_148,(uchar *)end,&local_140,&local_13c);
      mVar5 = local_13c;
      if (iVar4 != 0) {
        iVar4 = 0x882;
        goto LAB_00166598;
      }
      local_138 = puVar14;
      mVar6 = mbedtls_ssl_get_ciphersuite_sig_pk_alg(info);
      puVar14 = local_138;
      if (mVar5 != mVar6) {
        iVar4 = 0x888;
        goto LAB_00166598;
      }
    }
    else {
      if (2 < ssl->minor_ver) {
        iVar4 = 0x89b;
        goto LAB_00166469;
      }
      mVar5 = mbedtls_ssl_get_ciphersuite_sig_pk_alg(info);
      if (mVar5 == MBEDTLS_PK_ECDSA) {
        local_140 = MBEDTLS_MD_SHA1;
        mVar5 = MBEDTLS_PK_ECDSA;
      }
    }
    uVar7 = (ulong)(ushort)(*local_148 << 8 | *local_148 >> 8);
    puVar12 = local_148 + 1;
    if (end != (ushort *)((long)local_148 + uVar7 + 2)) {
      iVar4 = 0x8a7;
      local_148 = puVar12;
LAB_00166598:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,iVar4,"bad server key exchange message");
      return -0x7b00;
    }
    local_138 = (uchar *)CONCAT44(local_138._4_4_,mVar5);
    puVar14 = puVar14 + (ulong)((bVar3 & 2) >> 1) * 8 + 4;
    sVar13 = (long)puVar10 - (long)puVar14;
    local_148 = puVar12;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x8ab,"signature",(uchar *)puVar12,uVar7);
    md_type = local_140;
    if (local_140 == MBEDTLS_MD_NONE) {
      mbedtls_md5_init(&local_88);
      mbedtls_sha1_init(&local_e8);
      local_12c = md_type;
      mbedtls_md5_starts(&local_88);
      mbedtls_md5_update(&local_88,ssl->handshake->randbytes,0x40);
      mbedtls_md5_update(&local_88,puVar14,sVar13);
      mbedtls_md5_finish(&local_88,local_128);
      mbedtls_sha1_starts(&local_e8);
      mbedtls_sha1_update(&local_e8,ssl->handshake->randbytes,0x40);
      mbedtls_sha1_update(&local_e8,puVar14,sVar13);
      mbedtls_sha1_finish(&local_e8,local_118);
      md_type = local_12c;
      mbedtls_md5_free(&local_88);
      mbedtls_sha1_free(&local_e8);
      hash_len = 0x24;
      sVar13 = 0x24;
    }
    else {
      mbedtls_md_init((mbedtls_md_context_t *)&local_e8);
      pmVar8 = mbedtls_md_info_from_type(md_type);
      iVar4 = mbedtls_md_setup((mbedtls_md_context_t *)&local_e8,pmVar8,0);
      if (iVar4 != 0) {
        pcVar11 = "mbedtls_md_setup";
        iVar9 = 0x8ee;
        goto LAB_00166269;
      }
      mbedtls_md_starts((mbedtls_md_context_t *)&local_e8);
      mbedtls_md_update((mbedtls_md_context_t *)&local_e8,ssl->handshake->randbytes,0x40);
      mbedtls_md_update((mbedtls_md_context_t *)&local_e8,puVar14,sVar13);
      mbedtls_md_finish((mbedtls_md_context_t *)&local_e8,local_128);
      mbedtls_md_free((mbedtls_md_context_t *)&local_e8);
      pmVar8 = mbedtls_md_info_from_type(md_type);
      bVar3 = mbedtls_md_get_size(pmVar8);
      sVar13 = (size_t)bVar3;
      hash_len = 0;
    }
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x901,"parameters hash",local_128,sVar13);
    pmVar2 = ssl->session_negotiate->peer_cert;
    if (pmVar2 == (mbedtls_x509_crt *)0x0) {
      pcVar11 = "certificate required";
      iVar9 = 2;
      iVar4 = 0x905;
LAB_001662a1:
      mbedtls_debug_print_msg
                (ssl,iVar9,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,iVar4,pcVar11);
      return -0x7700;
    }
    iVar4 = mbedtls_pk_can_do(&pmVar2->pk,(mbedtls_pk_type_t)local_138);
    if (iVar4 == 0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x90e,"bad server key exchange message");
      return -0x6d00;
    }
    iVar4 = mbedtls_pk_verify(&ssl->session_negotiate->peer_cert->pk,md_type,local_128,hash_len,
                              (uchar *)local_148,uVar7);
    if (iVar4 != 0) {
      pcVar11 = "mbedtls_pk_verify";
      iVar9 = 0x915;
LAB_00166269:
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,iVar9,pcVar11,iVar4);
      return iVar4;
    }
  }
LAB_00166765:
  ssl->state = ssl->state + 1;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x920,"<= parse server key exchange");
  return 0;
}

Assistant:

static int ssl_parse_server_key_exchange( mbedtls_ssl_context *ssl )
{
    int ret;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;
    unsigned char *p, *end;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse server key exchange" ) );

#if defined(MBEDTLS_KEY_EXCHANGE_RSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse server key exchange" ) );
        ssl->state++;
        return( 0 );
    }
    ((void) p);
    ((void) end);
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED) || \
    defined(MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA )
    {
        if( ( ret = ssl_get_ecdh_params_from_cert( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "ssl_get_ecdh_params_from_cert", ret );
            return( ret );
        }

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse server key exchange" ) );
        ssl->state++;
        return( 0 );
    }
    ((void) p);
    ((void) end);
#endif /* MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED */

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    /*
     * ServerKeyExchange may be skipped with PSK and RSA-PSK when the server
     * doesn't use a psk_identity_hint
     */
    if( ssl->in_msg[0] != MBEDTLS_SSL_HS_SERVER_KEY_EXCHANGE )
    {
        if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
            ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
        {
            ssl->record_read = 1;
            goto exit;
        }

        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    p   = ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl );
    end = ssl->in_msg + ssl->in_hslen;
    MBEDTLS_SSL_DEBUG_BUF( 3,   "server key exchange", p, end - p );

#if defined(MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        if( ssl_parse_server_psk_hint( ssl, &p, end ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }
    } /* FALLTROUGH */
#endif /* MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED */

#if defined(MBEDTLS_KEY_EXCHANGE_PSK_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
        ; /* nothing more to do */
    else
#endif /* MBEDTLS_KEY_EXCHANGE_PSK_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK )
    {
        if( ssl_parse_server_dh_params( ssl, &p, end ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA )
    {
        if( ssl_parse_server_ecdh_params( ssl, &p, end ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA )
    {
        size_t sig_len, hashlen;
        unsigned char hash[64];
        mbedtls_md_type_t md_alg = MBEDTLS_MD_NONE;
        mbedtls_pk_type_t pk_alg = MBEDTLS_PK_NONE;
        unsigned char *params = ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl );
        size_t params_len = p - params;

        /*
         * Handle the digitally-signed structure
         */
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
        {
            if( ssl_parse_signature_algorithm( ssl, &p, end,
                                               &md_alg, &pk_alg ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
                return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
            }

            if( pk_alg != mbedtls_ssl_get_ciphersuite_sig_pk_alg( ciphersuite_info ) )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
                return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
            }
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
        if( ssl->minor_ver < MBEDTLS_SSL_MINOR_VERSION_3 )
        {
            pk_alg = mbedtls_ssl_get_ciphersuite_sig_pk_alg( ciphersuite_info );

            /* Default hash for ECDSA is SHA-1 */
            if( pk_alg == MBEDTLS_PK_ECDSA && md_alg == MBEDTLS_MD_NONE )
                md_alg = MBEDTLS_MD_SHA1;
        }
        else
#endif
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        /*
         * Read signature
         */
        sig_len = ( p[0] << 8 ) | p[1];
        p += 2;

        if( end != p + sig_len )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }

        MBEDTLS_SSL_DEBUG_BUF( 3, "signature", p, sig_len );

        /*
         * Compute the hash that has been signed
         */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
        if( md_alg == MBEDTLS_MD_NONE )
        {
            mbedtls_md5_context mbedtls_md5;
            mbedtls_sha1_context mbedtls_sha1;

            mbedtls_md5_init(  &mbedtls_md5  );
            mbedtls_sha1_init( &mbedtls_sha1 );

            hashlen = 36;

            /*
             * digitally-signed struct {
             *     opaque md5_hash[16];
             *     opaque sha_hash[20];
             * };
             *
             * md5_hash
             *     MD5(ClientHello.random + ServerHello.random
             *                            + ServerParams);
             * sha_hash
             *     SHA(ClientHello.random + ServerHello.random
             *                            + ServerParams);
             */
            mbedtls_md5_starts( &mbedtls_md5 );
            mbedtls_md5_update( &mbedtls_md5, ssl->handshake->randbytes, 64 );
            mbedtls_md5_update( &mbedtls_md5, params, params_len );
            mbedtls_md5_finish( &mbedtls_md5, hash );

            mbedtls_sha1_starts( &mbedtls_sha1 );
            mbedtls_sha1_update( &mbedtls_sha1, ssl->handshake->randbytes, 64 );
            mbedtls_sha1_update( &mbedtls_sha1, params, params_len );
            mbedtls_sha1_finish( &mbedtls_sha1, hash + 16 );

            mbedtls_md5_free(  &mbedtls_md5  );
            mbedtls_sha1_free( &mbedtls_sha1 );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_SSL3 || MBEDTLS_SSL_PROTO_TLS1 || \
          MBEDTLS_SSL_PROTO_TLS1_1 */
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( md_alg != MBEDTLS_MD_NONE )
        {
            mbedtls_md_context_t ctx;

            mbedtls_md_init( &ctx );

            /* Info from md_alg will be used instead */
            hashlen = 0;

            /*
             * digitally-signed struct {
             *     opaque client_random[32];
             *     opaque server_random[32];
             *     ServerDHParams params;
             * };
             */
            if( ( ret = mbedtls_md_setup( &ctx,
                                     mbedtls_md_info_from_type( md_alg ), 0 ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_md_setup", ret );
                return( ret );
            }

            mbedtls_md_starts( &ctx );
            mbedtls_md_update( &ctx, ssl->handshake->randbytes, 64 );
            mbedtls_md_update( &ctx, params, params_len );
            mbedtls_md_finish( &ctx, hash );
            mbedtls_md_free( &ctx );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1 || MBEDTLS_SSL_PROTO_TLS1_1 || \
          MBEDTLS_SSL_PROTO_TLS1_2 */
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        MBEDTLS_SSL_DEBUG_BUF( 3, "parameters hash", hash, hashlen != 0 ? hashlen :
            (unsigned int) ( mbedtls_md_get_size( mbedtls_md_info_from_type( md_alg ) ) ) );

        if( ssl->session_negotiate->peer_cert == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "certificate required" ) );
            return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
        }

        /*
         * Verify signature
         */
        if( ! mbedtls_pk_can_do( &ssl->session_negotiate->peer_cert->pk, pk_alg ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            return( MBEDTLS_ERR_SSL_PK_TYPE_MISMATCH );
        }

        if( ( ret = mbedtls_pk_verify( &ssl->session_negotiate->peer_cert->pk,
                               md_alg, hash, hashlen, p, sig_len ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_pk_verify", ret );
            return( ret );
        }
    }
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED */

exit:
    ssl->state++;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse server key exchange" ) );

    return( 0 );
}